

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O2

bool Disassembler::labelExists(int line)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  pointer ppVar4;
  ulong uVar5;
  
  uVar3 = ((long)labels_abi_cxx11_.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  ppVar4 = labels_abi_cxx11_.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar3 == uVar5) break;
    piVar1 = &ppVar4->first;
    ppVar4 = ppVar4 + 1;
    uVar2 = uVar5 + 1;
  } while (*piVar1 != line + 2);
  return uVar5 < uVar3;
}

Assistant:

bool Disassembler::labelExists(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2)// .globl e .text
      return true;
  return false;
}